

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CascReadFile.cpp
# Opt level: O0

DWORD CascSetFilePointer(HANDLE hFile,LONG lFilePos,LONG *plFilePosHigh,DWORD dwMoveMethod)

{
  TCascFile *pTVar1;
  ulong local_58;
  uint local_4c;
  DWORD dwFilePosHi;
  ULONGLONG MoveOffset;
  ULONGLONG FilePosition;
  TCascFile *hf;
  DWORD dwMoveMethod_local;
  LONG *plFilePosHigh_local;
  LONG lFilePos_local;
  HANDLE hFile_local;
  
  pTVar1 = IsValidCascFileHandle(hFile);
  if (pTVar1 == (TCascFile *)0x0) {
    SetLastError(9);
    hFile_local._4_4_ = 0xffffffff;
  }
  else {
    if (dwMoveMethod == 0) {
      MoveOffset = 0;
    }
    else if (dwMoveMethod == 1) {
      MoveOffset = (ULONGLONG)pTVar1->FilePointer;
    }
    else {
      if (dwMoveMethod != 2) {
        SetLastError(0x16);
        return 0xffffffff;
      }
      MoveOffset = (ULONGLONG)pTVar1->ContentSize;
    }
    if (plFilePosHigh == (LONG *)0x0) {
      local_4c = 0;
      if ((lFilePos & 0x80000000U) != 0) {
        local_4c = 0xffffffff;
      }
    }
    else {
      local_4c = *plFilePosHigh;
    }
    local_58 = (ulong)local_4c << 0x20 | (long)lFilePos;
    if (MoveOffset + local_58 < MoveOffset) {
      local_58 = 0;
    }
    else {
      local_58 = MoveOffset + local_58;
    }
    if (local_58 >> 0x20 == 0) {
      pTVar1->FilePointer = (DWORD)local_58;
      if (plFilePosHigh != (LONG *)0x0) {
        *plFilePosHigh = 0;
      }
      hFile_local._4_4_ = pTVar1->FilePointer;
    }
    else {
      SetLastError(0x16);
      hFile_local._4_4_ = 0xffffffff;
    }
  }
  return hFile_local._4_4_;
}

Assistant:

DWORD WINAPI CascSetFilePointer(HANDLE hFile, LONG lFilePos, LONG * plFilePosHigh, DWORD dwMoveMethod)
{
    TCascFile * hf;
    ULONGLONG FilePosition;
    ULONGLONG MoveOffset;
    DWORD dwFilePosHi;

    // If the hFile is not a valid file handle, return an error.
    hf = IsValidCascFileHandle(hFile);
    if(hf == NULL)
    {
        SetLastError(ERROR_INVALID_HANDLE);
        return CASC_INVALID_POS;
    }

    // Get the relative point where to move from
    switch(dwMoveMethod)
    {
        case FILE_BEGIN:
            FilePosition = 0;
            break;

        case FILE_CURRENT:
            FilePosition = hf->FilePointer;
            break;

        case FILE_END:
            FilePosition = hf->ContentSize;
            break;

        default:
            SetLastError(ERROR_INVALID_PARAMETER);
            return CASC_INVALID_POS;
    }

    // Now get the move offset. Note that both values form
    // a signed 64-bit value (a file pointer can be moved backwards)
    if(plFilePosHigh != NULL)
        dwFilePosHi = *plFilePosHigh;
    else
        dwFilePosHi = (lFilePos & 0x80000000) ? 0xFFFFFFFF : 0;
    MoveOffset = MAKE_OFFSET64(dwFilePosHi, lFilePos);

    // Now calculate the new file pointer
    // Do not allow the file pointer to overflow
    FilePosition = ((FilePosition + MoveOffset) >= FilePosition) ? (FilePosition + MoveOffset) : 0;

    // CASC files can't be bigger than 4 GB.
    // We don't allow to go past 4 GB
    if(FilePosition >> 32)
    {
        SetLastError(ERROR_INVALID_PARAMETER);
        return CASC_INVALID_POS;
    }

    // Change the file position
    hf->FilePointer = (DWORD)FilePosition;

    // Return the new file position
    if(plFilePosHigh != NULL)
        *plFilePosHigh = 0;
    return hf->FilePointer;
}